

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Data<QHashPrivate::Node<int,_QVariant>_> *
QHashPrivate::Data<QHashPrivate::Node<int,_QVariant>_>::detached
          (Data<QHashPrivate::Node<int,_QVariant>_> *d,size_t size)

{
  Data<QHashPrivate::Node<int,_QVariant>_> *this;
  
  this = (Data<QHashPrivate::Node<int,_QVariant>_> *)operator_new(0x28);
  if (d == (Data<QHashPrivate::Node<int,_QVariant>_> *)0x0) {
    Data(this,size);
  }
  else {
    Data(this,d,size);
    if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (d->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (d->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        ~Data(d);
        operator_delete(d,0x28);
      }
    }
  }
  return this;
}

Assistant:

static Data *detached(Data *d, size_t size)
    {
        if (!d)
            return new Data(size);
        Data *dd = new Data(*d, size);
        if (!d->ref.deref())
            delete d;
        return dd;
    }